

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

uint * Dtt_ManLoadClasses(int nVars,int *pnClasses)

{
  uint uVar1;
  int nSizeW_00;
  char local_f8 [8];
  char pFileName [200];
  int nSizeW;
  int nSizeLog;
  uint *pTable;
  int *pnClasses_local;
  int nVars_local;
  
  uVar1 = (1 << ((byte)nVars & 0x1f)) - 2;
  nSizeW_00 = 1 << ((byte)uVar1 & 0x1f);
  sprintf(local_f8,"tableW%d.data",(ulong)uVar1);
  _nSizeW = Dau_ReadFile2(local_f8,nSizeW_00);
  if (_nSizeW == (uint *)0x0) {
    Dau_TruthEnum(nVars);
    _nSizeW = Dau_ReadFile2(local_f8,nSizeW_00);
  }
  Dtt_ManRenum(nVars,_nSizeW,pnClasses);
  return _nSizeW;
}

Assistant:

unsigned * Dtt_ManLoadClasses( int nVars, int * pnClasses )
{
    extern void Dau_TruthEnum(int nVars);
    unsigned * pTable = NULL;
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    char pFileName[200];
    sprintf( pFileName, "tableW%d.data", nSizeLog );
    pTable = Dau_ReadFile2( pFileName, nSizeW );
    if (pTable == NULL)
    {
        Dau_TruthEnum(nVars);
        pTable = Dau_ReadFile2( pFileName, nSizeW );
    }
    Dtt_ManRenum( nVars, pTable, pnClasses );
    return pTable;
}